

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

int gladLoadGLLoader(GLADloadproc load)

{
  int iVar1;
  GLubyte *pGVar2;
  code *in_RDI;
  bool local_11;
  uint local_4;
  
  GLVersion.major = 0;
  GLVersion.minor = 0;
  glad_glGetString = (PFNGLGETSTRINGPROC)(*in_RDI)("glGetString");
  if (glad_glGetString == (PFNGLGETSTRINGPROC)0x0) {
    local_4 = 0;
  }
  else {
    pGVar2 = (*glad_glGetString)(0x1f02);
    if (pGVar2 == (GLubyte *)0x0) {
      local_4 = 0;
    }
    else {
      find_coreGL();
      load_GL_VERSION_1_0((GLADloadproc)0x178ee3);
      load_GL_VERSION_1_1((GLADloadproc)0x178eed);
      load_GL_VERSION_1_2((GLADloadproc)0x178ef7);
      load_GL_VERSION_1_3((GLADloadproc)0x178f01);
      load_GL_VERSION_1_4((GLADloadproc)0x178f0b);
      load_GL_VERSION_1_5((GLADloadproc)0x178f15);
      load_GL_VERSION_2_0((GLADloadproc)0x178f1f);
      load_GL_VERSION_2_1((GLADloadproc)0x178f29);
      load_GL_VERSION_3_0((GLADloadproc)0x178f33);
      load_GL_VERSION_3_1((GLADloadproc)0x178f3d);
      load_GL_VERSION_3_2((GLADloadproc)0x178f47);
      load_GL_VERSION_3_3((GLADloadproc)0x178f51);
      load_GL_VERSION_4_0((GLADloadproc)0x178f5b);
      load_GL_VERSION_4_1((GLADloadproc)0x178f65);
      load_GL_VERSION_4_2((GLADloadproc)0x178f6f);
      load_GL_VERSION_4_3((GLADloadproc)0x178f79);
      load_GL_VERSION_4_4((GLADloadproc)0x178f83);
      load_GL_VERSION_4_5((GLADloadproc)0x178f8d);
      load_GL_VERSION_4_6((GLADloadproc)0x178f97);
      iVar1 = find_extensionsGL();
      if (iVar1 == 0) {
        local_4 = 0;
      }
      else {
        load_GL_ARB_bindless_texture((GLADloadproc)0x178fb5);
        local_11 = GLVersion.major != 0 || GLVersion.minor != 0;
        local_4 = (uint)local_11;
      }
    }
  }
  return local_4;
}

Assistant:

int gladLoadGLLoader(GLADloadproc load) {
	GLVersion.major = 0; GLVersion.minor = 0;
	glGetString = (PFNGLGETSTRINGPROC)load("glGetString");
	if(glGetString == NULL) return 0;
	if(glGetString(GL_VERSION) == NULL) return 0;
	find_coreGL();
	load_GL_VERSION_1_0(load);
	load_GL_VERSION_1_1(load);
	load_GL_VERSION_1_2(load);
	load_GL_VERSION_1_3(load);
	load_GL_VERSION_1_4(load);
	load_GL_VERSION_1_5(load);
	load_GL_VERSION_2_0(load);
	load_GL_VERSION_2_1(load);
	load_GL_VERSION_3_0(load);
	load_GL_VERSION_3_1(load);
	load_GL_VERSION_3_2(load);
	load_GL_VERSION_3_3(load);
	load_GL_VERSION_4_0(load);
	load_GL_VERSION_4_1(load);
	load_GL_VERSION_4_2(load);
	load_GL_VERSION_4_3(load);
	load_GL_VERSION_4_4(load);
	load_GL_VERSION_4_5(load);
	load_GL_VERSION_4_6(load);

	if (!find_extensionsGL()) return 0;
	load_GL_ARB_bindless_texture(load);
	return GLVersion.major != 0 || GLVersion.minor != 0;
}